

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sprites.cpp
# Opt level: O1

bool __thiscall Amiga::Sprite::advance_dma(Sprite *this,int offset,int y,bool is_first_line)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  
  if (1 < (uint)offset) {
    __assert_fail("offset == 0 || offset == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Sprites.cpp"
                  ,0x44,"bool Amiga::Sprite::advance_dma(int, int, bool)");
  }
  uVar2 = *(uint *)&(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14;
  uVar1 = (this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_
          [(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.ram_mask_ & uVar2];
  if ((uint)this->v_stop_ == y || is_first_line) {
    if (offset == 0) {
      *(char *)&this->v_start_ = (char)(uVar1 >> 8);
      this->h_start = (this->h_start & 1) + (uVar1 & 0xff) * 2;
    }
    else {
      this->h_start = uVar1 & 1 | this->h_start & 0x1fe;
      this->v_stop_ = (uVar1 & 2) << 7 | uVar1 >> 8;
      *(byte *)((long)&this->v_start_ + 1) = (byte)uVar1 >> 2 & 1;
      this->attached = (bool)((byte)uVar1 >> 7);
      this->visible = false;
    }
  }
  else {
    bVar3 = (bool)((uint)this->v_start_ == y | this->visible);
    this->visible = bVar3;
    if (bVar3 == false) {
      return false;
    }
    this->data[(uint)-(offset + -1)] = uVar1;
    this->visible = (bool)(bVar3 | offset + -1 == 0);
  }
  *(uint *)&(this->super_DMADevice<1UL,_0UL>).super_DMADeviceBase.field_0x14 = uVar2 + 1;
  return true;
}

Assistant:

bool Sprite::advance_dma(int offset, int y, bool is_first_line) {
	assert(offset == 0 || offset == 1);

	// Determine which word would be fetched, if DMA occurs.
	// A bit of a cheat.
	const uint16_t next_word = ram_[pointer_[0] & ram_mask_];

	// "When the vertical position of the beam counter is equal to the VSTOP
	// value in the sprite control words, the next two words fetched from the
	// sprite data structure are written into the sprite control registers
	// instead of being sent to the color registers"
	//
	// Guesswork, primarily from observing Spindizzy Worlds: the first line after
	// vertical blank also triggers a control reload. Seek to verify.
	if(y == v_stop_ || is_first_line) {
		if(offset) {
			// Second control word: stop position (mostly).
			set_stop_and_control(next_word);
		} else {
			// First control word: start position.
			set_start_position(next_word);
		}
	} else {
		visible |= y == v_start_;
		if(!visible) return false;	// Act as if there wasn't a fetch.

		// Write colour word 1, then colour word 0; 0 is the word that 'arms'
		// the sprite (i.e. makes it visible).
		set_image_data(1 - offset, next_word);
	}

	// Acknowledge the fetch.
	++pointer_[0];
	return true;
}